

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

void interactive(ChaiScript_Basic *chai)

{
  bool bVar1;
  ostream *poVar2;
  Boxed_Value val;
  string input;
  char local_101 [9];
  undefined1 local_f8 [16];
  uint local_e8;
  undefined4 uStack_e4;
  string local_d8;
  undefined1 local_b8 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_98;
  Exception_Handler local_88;
  undefined1 local_78 [40];
  Exception_Handler local_50;
  _Base_ptr local_40 [2];
  
  using_history();
  do {
    get_next_command_abi_cxx11_();
    local_78._0_8_ = (pointer)0x0;
    local_78._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_f8._0_8_ = (type_info *)&local_e8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_f8,"__EVAL__","");
    chaiscript::ChaiScript_Basic::eval
              ((ChaiScript_Basic *)local_b8,(string *)chai,&local_50,(string *)local_78);
    if ((type_info *)local_f8._0_8_ != (type_info *)&local_e8) {
      operator_delete((void *)local_f8._0_8_,CONCAT44(uStack_e4,local_e8) + 1);
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78._8_8_);
    }
    local_f8._0_8_ = &void::typeinfo;
    local_f8._8_8_ = &void::typeinfo;
    local_e8 = 8;
    bVar1 = chaiscript::Type_Info::bare_equal((Type_Info *)local_b8._0_8_,(Type_Info *)local_f8);
    if (!bVar1) {
      local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"to_string","");
      local_88.
      super___shared_ptr<chaiscript::detail::Exception_Handler_Base,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = (element_type *)0x0;
      local_88.
      super___shared_ptr<chaiscript::detail::Exception_Handler_Base,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_b8._16_8_ = &local_98;
      std::__cxx11::string::_M_construct<char_const*>((string *)(local_b8 + 0x10),"__EVAL__","");
      chaiscript::ChaiScript_Basic::
      eval<std::function<std::__cxx11::string(chaiscript::Boxed_Value_const&)>>
                ((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_chaiscript::Boxed_Value_&)>
                  *)local_78,chai,&local_d8,&local_88,(string *)(local_b8 + 0x10));
      if ((code *)local_78._16_8_ == (code *)0x0) {
        std::__throw_bad_function_call();
      }
      (*(code *)local_78._24_8_)((Type_Info *)local_f8,(string *)local_78,local_b8);
      poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cout,(char *)local_f8._0_8_,local_f8._8_8_);
      local_101[0] = '\n';
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,local_101,1);
      if ((type_info *)local_f8._0_8_ != (type_info *)&local_e8) {
        operator_delete((void *)local_f8._0_8_,CONCAT44(uStack_e4,local_e8) + 1);
      }
      if ((code *)local_78._16_8_ != (code *)0x0) {
        (*(code *)local_78._16_8_)((string *)local_78,(string *)local_78,3);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b8._16_8_ != &local_98) {
        operator_delete((void *)local_b8._16_8_,local_98._M_allocated_capacity + 1);
      }
      if (local_88.
          super___shared_ptr<chaiscript::detail::Exception_Handler_Base,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_88.
                   super___shared_ptr<chaiscript::detail::Exception_Handler_Base,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
        operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
      }
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b8._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b8._8_8_);
    }
    if (local_50.
        super___shared_ptr<chaiscript::detail::Exception_Handler_Base,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr != (element_type *)local_40) {
      operator_delete(local_50.
                      super___shared_ptr<chaiscript::detail::Exception_Handler_Base,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr,(ulong)((long)&local_40[0]->_M_color + 1));
    }
  } while( true );
}

Assistant:

void interactive(chaiscript::ChaiScript_Basic &chai) {
  using_history();

  for (;;) {
    std::string input = get_next_command();
    try {
      // evaluate input
      chaiscript::Boxed_Value val = chai.eval(input);

      // Then, we try to print the result of the evaluation to the user
      if (!val.get_type_info().bare_equal(chaiscript::user_type<void>())) {
        try {
          std::cout << chai.eval<std::function<std::string(const chaiscript::Boxed_Value &bv)>>("to_string")(val) << '\n';
        } catch (...) {
        } // If we can't, do nothing
      }
    } catch (const chaiscript::exception::eval_error &ee) {
      std::cout << ee.what();
      if (!ee.call_stack.empty()) {
        std::cout << "during evaluation at (" << ee.call_stack[0].start().line << ", " << ee.call_stack[0].start().column << ")";
      }
      std::cout << '\n';
    } catch (const std::exception &e) {
      std::cout << e.what();
      std::cout << '\n';
    }
  }
}